

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_round(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxu32 nLen;
  uint uVar2;
  char **zRest;
  double r;
  char zBuf [256];
  
  if (nArg < 1) {
    jx9_result_int(pCtx,0);
  }
  else {
    uVar1 = 0;
    if (nArg != 1) {
      uVar1 = jx9_value_to_int(apArg[1]);
      uVar2 = 0x1e;
      if ((int)uVar1 < 0x1e) {
        uVar2 = uVar1;
      }
      uVar1 = 0;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
    }
    r = jx9_value_to_double(*apArg);
    if (((uVar1 != 0) || (r < 0.0)) || (9.223372036854776e+18 <= r)) {
      if (((uVar1 != 0) || (0.0 <= r)) || (r <= -9.223372036854776e+18)) {
        zRest = (char **)(ulong)uVar1;
        nLen = SyBufferFormat(zBuf,0x100,"%.*f");
        SyStrToReal(zBuf,nLen,&r,zRest);
      }
      else {
        r = -(double)(long)(0.5 - r);
      }
    }
    else {
      r = (double)(long)(r + 0.5);
    }
    jx9_result_double(pCtx,r);
  }
  return 0;
}

Assistant:

static int jx9Builtin_round(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int n = 0;
	double r;
	if( nArg < 1 ){
		/* Missing argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the precision if available */
	if( nArg > 1 ){
		n = jx9_value_to_int(apArg[1]);
		if( n>30 ){
			n = 30;
		}
		if( n<0 ){
			n = 0;
		}
	}
	r = jx9_value_to_double(apArg[0]);
	/* If Y==0 and X will fit in a 64-bit int, 
     * handle the rounding directly.Otherwise 
	 * use our own cutsom printf [i.e:SyBufferFormat()].
     */
  if( n==0 && r>=0 && r<LARGEST_INT64-1 ){
    r = (double)((jx9_int64)(r+0.5));
  }else if( n==0 && r<0 && (-r)<LARGEST_INT64-1 ){
    r = -(double)((jx9_int64)((-r)+0.5));
  }else{
	  char zBuf[256];
	  sxu32 nLen;
	  nLen = SyBufferFormat(zBuf, sizeof(zBuf), "%.*f", n, r);
	  /* Convert the string to real number */
	  SyStrToReal(zBuf, nLen, (void *)&r, 0);
  }
  /* Return thr rounded value */
  jx9_result_double(pCtx, r);
  return JX9_OK;
}